

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_range.h
# Opt level: O3

iterator_range<llvm::AppleAcceleratorTable::ValueIterator> *
llvm::make_range<llvm::AppleAcceleratorTable::ValueIterator>
          (iterator_range<llvm::AppleAcceleratorTable::ValueIterator> *__return_storage_ptr__,
          ValueIterator *x,ValueIterator *y)

{
  iterator_range<llvm::AppleAcceleratorTable::ValueIterator> *piVar1;
  ValueIterator local_1c8;
  ValueIterator local_100;
  iterator_range<llvm::AppleAcceleratorTable::ValueIterator> *local_38;
  
  local_1c8.AccelTable = x->AccelTable;
  local_1c8.Current.super_Entry._vptr_Entry = (_func_int **)&PTR___cxa_pure_virtual_00d777d8;
  local_38 = __return_storage_ptr__;
  SmallVector<llvm::DWARFFormValue,_3U>::SmallVector
            (&local_1c8.Current.super_Entry.Values,&(x->Current).super_Entry.Values);
  local_1c8.Current.super_Entry._vptr_Entry = (_func_int **)&PTR_getCUOffset_00d776b8;
  local_1c8.Current.HdrData = (x->Current).HdrData;
  local_1c8.DataOffset = x->DataOffset;
  local_1c8.Data = x->Data;
  local_1c8.NumData = x->NumData;
  local_100.AccelTable = y->AccelTable;
  local_100.Current.super_Entry._vptr_Entry = (_func_int **)&PTR___cxa_pure_virtual_00d777d8;
  SmallVector<llvm::DWARFFormValue,_3U>::SmallVector
            (&local_100.Current.super_Entry.Values,&(y->Current).super_Entry.Values);
  piVar1 = local_38;
  local_100.Current.super_Entry._vptr_Entry = (_func_int **)&PTR_getCUOffset_00d776b8;
  local_100.Current.HdrData = (y->Current).HdrData;
  local_100.DataOffset = y->DataOffset;
  local_100.Data = y->Data;
  local_100.NumData = y->NumData;
  iterator_range<llvm::AppleAcceleratorTable::ValueIterator>::iterator_range
            (local_38,&local_1c8,&local_100);
  local_100.Current.super_Entry._vptr_Entry = (_func_int **)&PTR___cxa_pure_virtual_00d777d8;
  if ((SmallVectorStorage<llvm::DWARFFormValue,_3U> *)
      local_100.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
      super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
      super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX !=
      &local_100.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>) {
    free(local_100.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
         super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
         super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX);
  }
  local_1c8.Current.super_Entry._vptr_Entry = (_func_int **)&PTR___cxa_pure_virtual_00d777d8;
  if ((SmallVectorStorage<llvm::DWARFFormValue,_3U> *)
      local_1c8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
      super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
      super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX !=
      &local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>) {
    free(local_1c8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
         super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
         super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX);
  }
  return piVar1;
}

Assistant:

iterator_range<T> make_range(T x, T y) {
  return iterator_range<T>(std::move(x), std::move(y));
}